

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# App.hpp
# Opt level: O0

void __thiscall
CLI::App::_parse_arg
          (App *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *args,bool second_dash)

{
  int num_00;
  bool bVar1;
  bool bVar2;
  Classifer CVar3;
  reference pvVar4;
  HorribleError *pHVar5;
  pointer pOVar6;
  ulong uVar7;
  size_t sVar8;
  ArgumentMismatch *__return_storage_ptr__;
  byte local_381;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2d8;
  undefined1 local_2b1;
  string local_2b0;
  string local_290;
  pointer local_270;
  string local_268;
  string local_248 [8];
  string current_;
  string local_220;
  unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_> *local_1f8;
  unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_> *local_1f0;
  int local_1e4;
  pointer pOStack_1e0;
  int collected;
  string local_1d8;
  pointer local_1b8;
  allocator local_1a9;
  string local_1a8;
  pointer local_188;
  string local_180;
  int local_15c;
  reference puStack_158;
  int num;
  Option_p *op;
  __normal_iterator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_*,_std::vector<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>,_std::allocator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_>_>_>
  local_148;
  anon_class_40_2_8d6d5393_for__M_pred local_140;
  __normal_iterator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_*,_std::vector<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>,_std::allocator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_>_>_>
  local_118;
  __normal_iterator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_*,_std::vector<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>,_std::allocator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_>_>_>
  local_110;
  __normal_iterator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_*,_std::vector<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>,_std::allocator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_>_>_>
  local_108;
  __normal_iterator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_*,_std::vector<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>,_std::allocator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_>_>_>
  op_ptr;
  string local_f8;
  undefined1 local_d1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  undefined1 local_a0 [8];
  string rest;
  string value;
  string name;
  string current;
  Classifer current_type;
  bool second_dash_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *args_local;
  App *this_local;
  
  current.field_2._8_4_ = 2;
  if (second_dash) {
    current.field_2._8_4_ = 3;
  }
  current.field_2._M_local_buf[0xf] = second_dash;
  pvVar4 = std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::back(args);
  ::std::__cxx11::string::string((string *)(name.field_2._M_local_buf + 8),(string *)pvVar4);
  ::std::__cxx11::string::string((string *)(value.field_2._M_local_buf + 8));
  ::std::__cxx11::string::string((string *)(rest.field_2._M_local_buf + 8));
  ::std::__cxx11::string::string((string *)local_a0);
  if ((current.field_2._M_local_buf[0xf] & 1U) == 0) {
    bVar1 = detail::split_short((string *)((long)&name.field_2 + 8),
                                (string *)((long)&value.field_2 + 8),(string *)local_a0);
    if (!bVar1) {
      op_ptr._M_current._6_1_ = 1;
      pHVar5 = (HorribleError *)__cxa_allocate_exception(0x38);
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string
                ((string *)&local_f8,"Short parsed but missing! You should not see this",
                 (allocator *)((long)&op_ptr._M_current + 7));
      HorribleError::HorribleError(pHVar5,&local_f8);
      op_ptr._M_current._6_1_ = 0;
      __cxa_throw(pHVar5,&HorribleError::typeinfo,HorribleError::~HorribleError);
    }
  }
  else {
    bVar1 = detail::split_long((string *)((long)&name.field_2 + 8),
                               (string *)((long)&value.field_2 + 8),
                               (string *)((long)&rest.field_2 + 8));
    if (!bVar1) {
      local_d1 = 1;
      pHVar5 = (HorribleError *)__cxa_allocate_exception(0x38);
      pvVar4 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::back(args);
      ::std::operator+(&local_d0,"Long parsed but missing (you should not see this):",pvVar4);
      HorribleError::HorribleError(pHVar5,&local_d0);
      local_d1 = 0;
      __cxa_throw(pHVar5,&HorribleError::typeinfo,HorribleError::~HorribleError);
    }
  }
  local_110._M_current =
       (unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_> *)
       ::std::
       begin<std::vector<std::unique_ptr<CLI::Option,std::default_delete<CLI::Option>>,std::allocator<std::unique_ptr<CLI::Option,std::default_delete<CLI::Option>>>>>
                 (&this->options_);
  local_118._M_current =
       (unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_> *)
       ::std::
       end<std::vector<std::unique_ptr<CLI::Option,std::default_delete<CLI::Option>>,std::allocator<std::unique_ptr<CLI::Option,std::default_delete<CLI::Option>>>>>
                 (&this->options_);
  ::std::__cxx11::string::string((string *)&local_140,(string *)(value.field_2._M_local_buf + 8));
  local_140.second_dash = (bool)(current.field_2._M_local_buf[0xf] & 1);
  local_108 = ::std::
              find_if<__gnu_cxx::__normal_iterator<std::unique_ptr<CLI::Option,std::default_delete<CLI::Option>>*,std::vector<std::unique_ptr<CLI::Option,std::default_delete<CLI::Option>>,std::allocator<std::unique_ptr<CLI::Option,std::default_delete<CLI::Option>>>>>,CLI::App::_parse_arg(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&,bool)::_lambda(std::unique_ptr<CLI::Option,std::default_delete<CLI::Option>>const&)_1_>
                        (local_110,local_118,&local_140);
  _parse_arg(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&,bool)::
  {lambda(std::unique_ptr<CLI::Option,std::default_delete<CLI::Option>>const&)#1}::~unique_ptr
            ((_lambda_std__unique_ptr<CLI::Option,std::default_delete<CLI::Option>>const___1_ *)
             &local_140);
  local_148._M_current =
       (unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_> *)
       ::std::
       end<std::vector<std::unique_ptr<CLI::Option,std::default_delete<CLI::Option>>,std::allocator<std::unique_ptr<CLI::Option,std::default_delete<CLI::Option>>>>>
                 (&this->options_);
  bVar1 = __gnu_cxx::operator==(&local_108,&local_148);
  if (bVar1) {
    if ((this->parent_ == (App *)0x0) || ((this->fallthrough_ & 1U) == 0)) {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::pop_back(args);
      ::std::
      vector<std::pair<CLI::detail::Classifer,std::__cxx11::string>,std::allocator<std::pair<CLI::detail::Classifer,std::__cxx11::string>>>
      ::emplace_back<CLI::detail::Classifer&,std::__cxx11::string&>
                ((vector<std::pair<CLI::detail::Classifer,std::__cxx11::string>,std::allocator<std::pair<CLI::detail::Classifer,std::__cxx11::string>>>
                  *)&this->missing_,(Classifer *)(current.field_2._M_local_buf + 8),
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 ((long)&name.field_2 + 8));
      op._4_4_ = 1;
    }
    else {
      _parse_arg(this->parent_,args,(bool)(current.field_2._M_local_buf[0xf] & 1));
      op._4_4_ = 1;
    }
  }
  else {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::pop_back(args);
    puStack_158 = __gnu_cxx::
                  __normal_iterator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_*,_std::vector<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>,_std::allocator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_>_>_>
                  ::operator*(&local_108);
    pOVar6 = std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>::operator->
                       (puStack_158);
    local_15c = Option::get_expected(pOVar6);
    uVar7 = ::std::__cxx11::string::empty();
    if ((uVar7 & 1) == 0) {
      if (local_15c != -1) {
        local_15c = local_15c + -1;
      }
      pOVar6 = std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>::operator->
                         (puStack_158);
      ::std::__cxx11::string::string((string *)&local_180,(string *)(rest.field_2._M_local_buf + 8))
      ;
      Option::add_result(pOVar6,&local_180);
      ::std::__cxx11::string::~string((string *)&local_180);
      local_188 = std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>::get(puStack_158);
      std::vector<CLI::Option_*,_std::allocator<CLI::Option_*>_>::push_back
                (&this->parse_order_,&local_188);
    }
    else if (local_15c == 0) {
      pOVar6 = std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>::operator->
                         (puStack_158);
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string((string *)&local_1a8,"",&local_1a9);
      Option::add_result(pOVar6,&local_1a8);
      ::std::__cxx11::string::~string((string *)&local_1a8);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_1a9);
      local_1b8 = std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>::get(puStack_158);
      std::vector<CLI::Option_*,_std::allocator<CLI::Option_*>_>::push_back
                (&this->parse_order_,&local_1b8);
    }
    else {
      uVar7 = ::std::__cxx11::string::empty();
      if ((uVar7 & 1) == 0) {
        if (0 < local_15c) {
          local_15c = local_15c + -1;
        }
        pOVar6 = std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>::operator->
                           (puStack_158);
        ::std::__cxx11::string::string((string *)&local_1d8,(string *)local_a0);
        Option::add_result(pOVar6,&local_1d8);
        ::std::__cxx11::string::~string((string *)&local_1d8);
        pOStack_1e0 = std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>::get
                                (puStack_158);
        std::vector<CLI::Option_*,_std::allocator<CLI::Option_*>_>::push_back
                  (&this->parse_order_,&stack0xfffffffffffffe20);
        ::std::__cxx11::string::operator=((string *)local_a0,"");
      }
    }
    if (local_15c < 0) {
      local_1e4 = 0;
      do {
        bVar2 = std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::empty(args);
        bVar1 = false;
        if (!bVar2) {
          pvVar4 = std::
                   vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::back(args);
          CVar3 = _recognize(this,pvVar4);
          bVar1 = CVar3 == NONE;
        }
        if (!bVar1) goto LAB_001184ad;
        if (SBORROW4(local_1e4,-local_15c) == local_1e4 + local_15c < 0) {
          sVar8 = _count_remaining_positionals(this,false);
          if (sVar8 != 0) goto LAB_001184ad;
          local_1f0 = (unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_> *)
                      ::std::
                      begin<std::vector<std::unique_ptr<CLI::Option,std::default_delete<CLI::Option>>,std::allocator<std::unique_ptr<CLI::Option,std::default_delete<CLI::Option>>>>>
                                (&this->options_);
          local_1f8 = (unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_> *)
                      ::std::
                      end<std::vector<std::unique_ptr<CLI::Option,std::default_delete<CLI::Option>>,std::allocator<std::unique_ptr<CLI::Option,std::default_delete<CLI::Option>>>>>
                                (&this->options_);
          bVar1 = ::std::
                  any_of<__gnu_cxx::__normal_iterator<std::unique_ptr<CLI::Option,std::default_delete<CLI::Option>>*,std::vector<std::unique_ptr<CLI::Option,std::default_delete<CLI::Option>>,std::allocator<std::unique_ptr<CLI::Option,std::default_delete<CLI::Option>>>>>,CLI::App::_parse_arg(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&,bool)::_lambda(std::unique_ptr<CLI::Option,std::default_delete<CLI::Option>>const&)_2_>
                            (local_1f0,local_1f8);
          if (bVar1) goto LAB_001184ad;
        }
        pOVar6 = std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>::operator->
                           (puStack_158);
        pvVar4 = std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::back(args);
        ::std::__cxx11::string::string((string *)&local_220,(string *)pvVar4);
        Option::add_result(pOVar6,&local_220);
        ::std::__cxx11::string::~string((string *)&local_220);
        current_.field_2._8_8_ =
             std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>::get(puStack_158);
        std::vector<CLI::Option_*,_std::allocator<CLI::Option_*>_>::push_back
                  (&this->parse_order_,(value_type *)((long)&current_.field_2 + 8));
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::pop_back(args);
        local_1e4 = local_1e4 + 1;
      } while( true );
    }
    while( true ) {
      local_381 = 0;
      if (0 < local_15c) {
        bVar1 = std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::empty(args);
        local_381 = bVar1 ^ 0xff;
      }
      if ((local_381 & 1) == 0) break;
      local_15c = local_15c + -1;
      pvVar4 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::back(args);
      ::std::__cxx11::string::string(local_248,(string *)pvVar4);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::pop_back(args);
      pOVar6 = std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>::operator->
                         (puStack_158);
      ::std::__cxx11::string::string((string *)&local_268,local_248);
      Option::add_result(pOVar6,&local_268);
      ::std::__cxx11::string::~string((string *)&local_268);
      local_270 = std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>::get(puStack_158);
      std::vector<CLI::Option_*,_std::allocator<CLI::Option_*>_>::push_back
                (&this->parse_order_,&local_270);
      ::std::__cxx11::string::~string(local_248);
    }
    if (0 < local_15c) {
      local_2b1 = 1;
      __return_storage_ptr__ = (ArgumentMismatch *)__cxa_allocate_exception(0x38);
      pOVar6 = std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>::operator->
                         (puStack_158);
      Option::single_name_abi_cxx11_(&local_290,pOVar6);
      num_00 = local_15c;
      pOVar6 = std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>::operator->
                         (puStack_158);
      Option::get_type_name_abi_cxx11_(&local_2b0,pOVar6);
      ArgumentMismatch::TypedAtLeast(__return_storage_ptr__,&local_290,num_00,&local_2b0);
      local_2b1 = 0;
      __cxa_throw(__return_storage_ptr__,&ArgumentMismatch::typeinfo,
                  ArgumentMismatch::~ArgumentMismatch);
    }
LAB_001184ad:
    uVar7 = ::std::__cxx11::string::empty();
    if ((uVar7 & 1) == 0) {
      ::std::operator+(&local_2d8,"-",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_a0
                      );
      ::std::__cxx11::string::operator=((string *)local_a0,(string *)&local_2d8);
      ::std::__cxx11::string::~string((string *)&local_2d8);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(args,(value_type *)local_a0);
    }
    op._4_4_ = 0;
  }
  ::std::__cxx11::string::~string((string *)local_a0);
  ::std::__cxx11::string::~string((string *)(rest.field_2._M_local_buf + 8));
  ::std::__cxx11::string::~string((string *)(value.field_2._M_local_buf + 8));
  ::std::__cxx11::string::~string((string *)(name.field_2._M_local_buf + 8));
  return;
}

Assistant:

void _parse_arg(std::vector<std::string> &args, bool second_dash) {

        detail::Classifer current_type = second_dash ? detail::Classifer::LONG : detail::Classifer::SHORT;

        std::string current = args.back();

        std::string name;
        std::string value;
        std::string rest;

        if(second_dash) {
            if(!detail::split_long(current, name, value))
                throw HorribleError("Long parsed but missing (you should not see this):" + args.back());
        } else {
            if(!detail::split_short(current, name, rest))
                throw HorribleError("Short parsed but missing! You should not see this");
        }

        auto op_ptr = std::find_if(std::begin(options_), std::end(options_), [name, second_dash](const Option_p &opt) {
            return second_dash ? opt->check_lname(name) : opt->check_sname(name);
        });

        // Option not found
        if(op_ptr == std::end(options_)) {
            // If a subcommand, try the master command
            if(parent_ != nullptr && fallthrough_)
                return parent_->_parse_arg(args, second_dash);
            // Otherwise, add to missing
            else {
                args.pop_back();
                missing_.emplace_back(current_type, current);
                return;
            }
        }

        args.pop_back();

        // Get a reference to the pointer to make syntax bearable
        Option_p &op = *op_ptr;

        int num = op->get_expected();

        if(!value.empty()) {
            if(num != -1)
                num--;
            op->add_result(value);
            parse_order_.push_back(op.get());
        } else if(num == 0) {
            op->add_result("");
            parse_order_.push_back(op.get());
        } else if(!rest.empty()) {
            if(num > 0)
                num--;
            op->add_result(rest);
            parse_order_.push_back(op.get());
            rest = "";
        }

        // Unlimited vector parser
        if(num < 0) {
            int collected = 0; // Make sure we always eat the minimum
            while(!args.empty() && _recognize(args.back()) == detail::Classifer::NONE) {
                if(collected >= -num) {
                    // We could break here for allow extras, but we don't

                    // If any positionals remain, don't keep eating
                    if(_count_remaining_positionals() > 0)
                        break;

                    // If there are any unlimited positionals, those also take priority
                    if(std::any_of(std::begin(options_), std::end(options_), [](const Option_p &opt) {
                           return opt->get_positional() && opt->get_expected() < 0;
                       }))
                        break;
                }
                op->add_result(args.back());
                parse_order_.push_back(op.get());
                args.pop_back();
                collected++;
            }

        } else {
            while(num > 0 && !args.empty()) {
                num--;
                std::string current_ = args.back();
                args.pop_back();
                op->add_result(current_);
                parse_order_.push_back(op.get());
            }

            if(num > 0) {
                throw ArgumentMismatch::TypedAtLeast(op->single_name(), num, op->get_type_name());
            }
        }

        if(!rest.empty()) {
            rest = "-" + rest;
            args.push_back(rest);
        }
    }